

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::~Compiler(Compiler *this)

{
  Impl *pIVar1;
  Disposer *pDVar2;
  
  SchemaLoader::~SchemaLoader(&this->loader);
  pIVar1 = (this->impl).value.ptr;
  if (pIVar1 != (Impl *)0x0) {
    (this->impl).value.ptr = (Impl *)0x0;
    pDVar2 = (this->impl).value.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pIVar1->super_LazyLoadCallback)._vptr_LazyLoadCallback[-2] + -0x68 +
                      (long)&(pIVar1->workspace).message);
  }
  kj::_::Mutex::~Mutex(&(this->impl).mutex);
  return;
}

Assistant:

Compiler::~Compiler() noexcept(false) {}